

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buchb.h
# Opt level: O0

void __thiscall
GF2::Buchb<8UL,_GF2::MOGrevlex<8UL>,_GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>::_Update
          (Buchb<8UL,_GF2::MOGrevlex<8UL>,_GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_> *this,
          iterator posPoly)

{
  iterator i2;
  const_iterator __position;
  bool bVar1;
  WW<8UL> *this_00;
  pointer pCVar2;
  _List_node_base *in_RSI;
  long in_RDI;
  CritPair<8UL,_GF2::MOGrevlex<8UL>_> newpair;
  size_t var;
  _Iterator posReserve;
  _Iterator posBasis;
  _CPs newpairs;
  iterator posPair;
  list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
  *in_stack_00000470;
  MP<8UL,_GF2::MOGrevlex<8UL>_> *in_stack_fffffffffffffd98;
  undefined7 in_stack_fffffffffffffda0;
  undefined1 in_stack_fffffffffffffda7;
  iterator in_stack_fffffffffffffda8;
  undefined7 in_stack_fffffffffffffdb0;
  undefined1 in_stack_fffffffffffffdb7;
  iterator in_stack_fffffffffffffdb8;
  iterator in_stack_fffffffffffffdc0;
  undefined1 in_stack_fffffffffffffdc8;
  undefined1 in_stack_fffffffffffffdc9;
  byte in_stack_fffffffffffffdca;
  undefined1 in_stack_fffffffffffffdcb;
  undefined1 in_stack_fffffffffffffdcc;
  undefined1 in_stack_fffffffffffffdcd;
  undefined1 in_stack_fffffffffffffdce;
  undefined1 in_stack_fffffffffffffdcf;
  MI<8UL,_GF2::MOGrevlex<8UL>_> *in_stack_fffffffffffffdd0;
  iterator in_stack_fffffffffffffdd8;
  byte local_21a;
  _List_const_iterator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_> local_1d0;
  _List_node_base *local_1c8;
  _Self local_1c0;
  _List_node_base *local_1b8;
  _List_node_base *local_1b0;
  _List_const_iterator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_> local_1a8;
  _List_const_iterator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_> local_1a0;
  _List_node_base *local_198;
  _Self local_188;
  _List_node_base *local_180;
  _Self local_178;
  _List_const_iterator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_> local_170;
  _List_node_base *local_168;
  _Self local_158;
  _List_node_base *local_150;
  _List_node_base *local_148;
  _List_node_base *local_140;
  _Self local_108;
  _List_node_base *local_100;
  _List_node_base *local_f8;
  ulong local_c0;
  _List_node_base *local_b8;
  _List_node_base *local_b0;
  _List_node_base *local_78;
  _List_node_base *local_70;
  _Self local_58;
  _Self local_50 [4];
  _List_const_iterator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_> local_30;
  _List_node_base *local_28;
  _Self local_20;
  _Self local_18 [2];
  _Self local_8;
  
  local_8._M_node = in_RSI;
  local_18[0]._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
       ::begin((list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                *)in_stack_fffffffffffffd98);
LAB_001cec18:
  do {
    local_20._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
         ::end((list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                *)in_stack_fffffffffffffd98);
    bVar1 = std::operator!=(local_18,&local_20);
    if (!bVar1) {
      std::__cxx11::
      list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
      ::list((list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
              *)0x1ced43);
      local_50[0]._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
           ::begin((list<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                    *)in_stack_fffffffffffffd98);
      while( true ) {
        local_58._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
             ::end((list<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                    *)in_stack_fffffffffffffd98);
        bVar1 = std::operator!=(local_50,&local_58);
        if (!bVar1) break;
        bVar1 = std::operator==(&local_8,local_50);
        if (bVar1) {
          std::_List_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>::operator++(local_50);
        }
        else {
          std::_List_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>::operator->
                    ((_List_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_> *)0x1cedca);
          MP<8UL,_GF2::MOGrevlex<8UL>_>::LM
                    ((MP<8UL,_GF2::MOGrevlex<8UL>_> *)
                     CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
          std::_List_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>::operator->
                    ((_List_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_> *)0x1cede4);
          MP<8UL,_GF2::MOGrevlex<8UL>_>::LM
                    ((MP<8UL,_GF2::MOGrevlex<8UL>_> *)
                     CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
          bVar1 = MM<8ul>::operator|((MM<8UL> *)
                                     CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
                                     (MM<8UL> *)in_stack_fffffffffffffd98);
          if (bVar1) {
            local_78 = (_List_node_base *)
                       std::_List_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>::operator++
                                 (local_50,0);
            local_b0 = (_List_node_base *)
                       MI<8UL,_GF2::MOGrevlex<8UL>_>::Splice
                                 (in_stack_fffffffffffffdd0,
                                  (MI<8UL,_GF2::MOGrevlex<8UL>_> *)
                                  CONCAT17(in_stack_fffffffffffffdcf,
                                           CONCAT16(in_stack_fffffffffffffdce,
                                                    CONCAT15(in_stack_fffffffffffffdcd,
                                                             CONCAT14(in_stack_fffffffffffffdcc,
                                                                      CONCAT13(
                                                  in_stack_fffffffffffffdcb,
                                                  CONCAT12(in_stack_fffffffffffffdca,
                                                           CONCAT11(in_stack_fffffffffffffdc9,
                                                                    in_stack_fffffffffffffdc8)))))))
                                  ,in_stack_fffffffffffffdd8);
            local_b8 = local_8._M_node;
            local_70 = local_b0;
            CritPair<8UL,_GF2::MOGrevlex<8UL>_>::CritPair
                      ((CritPair<8UL,_GF2::MOGrevlex<8UL>_> *)
                       CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),
                       in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
            std::__cxx11::
            list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
            ::push_front((list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                          *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),
                         (value_type *)in_stack_fffffffffffffda8._M_node);
            *(long *)(in_RDI + 0xb0) = *(long *)(in_RDI + 0xb0) + 1;
          }
          else {
            std::_List_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>::operator->
                      ((_List_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_> *)0x1cef10);
            std::_List_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>::operator*
                      ((_List_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_> *)0x1cef22);
            MP<8ul,GF2::MOGrevlex<8ul>>::Mod<GF2::MOGrevlex<8ul>>
                      ((MP<8UL,_GF2::MOGrevlex<8UL>_> *)
                       CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
                       in_stack_fffffffffffffd98);
            std::_List_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>::operator++(local_50);
          }
        }
      }
      std::__cxx11::
      list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
      ::sort(in_stack_00000470);
      std::__cxx11::
      list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
      ::merge((list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
               *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
              (list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
               *)in_stack_fffffffffffffd98);
      for (local_c0 = 0; local_c0 < 8; local_c0 = local_c0 + 1) {
        std::_List_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>::operator->
                  ((_List_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_> *)0x1cef95);
        this_00 = &MP<8UL,_GF2::MOGrevlex<8UL>_>::LM
                             ((MP<8UL,_GF2::MOGrevlex<8UL>_> *)
                              CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0))->
                   super_WW<8UL>;
        bVar1 = WW<8UL>::Test(this_00,local_c0);
        if (bVar1) {
          local_f8 = local_8._M_node;
          i2._M_node._7_1_ = in_stack_fffffffffffffdb7;
          i2._M_node._0_7_ = in_stack_fffffffffffffdb0;
          CritPair<8UL,_GF2::MOGrevlex<8UL>_>::CritPair
                    ((CritPair<8UL,_GF2::MOGrevlex<8UL>_> *)in_stack_fffffffffffffda8._M_node,
                     CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),i2);
          std::__cxx11::
          list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
          ::push_front((list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                        *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),
                       (value_type *)in_stack_fffffffffffffda8._M_node);
        }
      }
      local_100 = (_List_node_base *)
                  std::__cxx11::
                  list<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                  ::begin((list<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                           *)in_stack_fffffffffffffd98);
      local_50[0]._M_node = local_100;
      do {
        local_108._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
             ::end((list<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                    *)in_stack_fffffffffffffd98);
        bVar1 = std::operator!=(local_50,&local_108);
        if (!bVar1) {
          local_1b8 = (_List_node_base *)
                      std::__cxx11::
                      list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                      ::begin((list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                               *)in_stack_fffffffffffffd98);
          local_18[0]._M_node = local_1b8;
          while( true ) {
            local_1c0._M_node =
                 (_List_node_base *)
                 std::__cxx11::
                 list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                 ::end((list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                        *)in_stack_fffffffffffffd98);
            bVar1 = std::operator!=(local_18,&local_1c0);
            if (!bVar1) break;
            std::_List_iterator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>::operator->
                      ((_List_iterator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_> *)0x1cf59b);
            in_stack_fffffffffffffda7 =
                 CritPair<8UL,_GF2::MOGrevlex<8UL>_>::IsRelPrime
                           ((CritPair<8UL,_GF2::MOGrevlex<8UL>_> *)
                            CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0));
            if ((bool)in_stack_fffffffffffffda7) {
              *(long *)(in_RDI + 0xa8) = *(long *)(in_RDI + 0xa8) + 1;
              std::_List_const_iterator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>::
              _List_const_iterator(&local_1d0,local_18);
              local_1c8 = (_List_node_base *)
                          std::__cxx11::
                          list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                          ::erase((list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                                   *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
                                  in_stack_fffffffffffffda8._M_node);
              local_18[0]._M_node = local_1c8;
            }
            else {
              std::_List_iterator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>::operator++(local_18);
            }
          }
          std::__cxx11::
          list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
          ::sort(in_stack_00000470);
          std::__cxx11::
          list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
          ::merge((list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                   *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
                  (list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                   *)in_stack_fffffffffffffd98);
          std::__cxx11::
          list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
          ::~list((list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                   *)0x1cf65a);
          return;
        }
        bVar1 = std::operator==(local_50,&local_8);
        if (!bVar1) {
          local_140 = local_50[0]._M_node;
          local_148 = local_8._M_node;
          CritPair<8UL,_GF2::MOGrevlex<8UL>_>::CritPair
                    ((CritPair<8UL,_GF2::MOGrevlex<8UL>_> *)
                     CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),
                     in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
          local_150 = (_List_node_base *)
                      std::__cxx11::
                      list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                      ::begin((list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                               *)in_stack_fffffffffffffd98);
          local_18[0]._M_node = local_150;
          while( true ) {
            local_158._M_node =
                 (_List_node_base *)
                 std::__cxx11::
                 list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                 ::end((list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                        *)in_stack_fffffffffffffd98);
            bVar1 = std::operator!=(local_18,&local_158);
            if (!bVar1) break;
            std::_List_iterator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>::operator*
                      ((_List_iterator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_> *)0x1cf13a);
            bVar1 = CritPair<8UL,_GF2::MOGrevlex<8UL>_>::operator|
                              ((CritPair<8UL,_GF2::MOGrevlex<8UL>_> *)
                               CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),
                               (CritPair<8UL,_GF2::MOGrevlex<8UL>_> *)
                               in_stack_fffffffffffffda8._M_node);
            local_21a = 0;
            if (bVar1) {
              std::_List_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>::operator->
                        ((_List_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_> *)0x1cf16e);
              MP<8UL,_GF2::MOGrevlex<8UL>_>::LM
                        ((MP<8UL,_GF2::MOGrevlex<8UL>_> *)
                         CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
              std::_List_iterator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>::operator->
                        ((_List_iterator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_> *)0x1cf188);
              std::_List_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>::operator->
                        ((_List_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_> *)0x1cf19e);
              MP<8UL,_GF2::MOGrevlex<8UL>_>::LM
                        ((MP<8UL,_GF2::MOGrevlex<8UL>_> *)
                         CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
              LCM<8ul,8ul>((MM<8UL> *)in_stack_fffffffffffffdb8._M_node,
                           (MM<8UL> *)CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0))
              ;
              in_stack_fffffffffffffdcf =
                   MM<8ul>::operator|((MM<8UL> *)
                                      CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
                                      (MM<8UL> *)in_stack_fffffffffffffd98);
              local_21a = in_stack_fffffffffffffdcf ^ 0xff;
            }
            if ((local_21a & 1) == 0) {
              std::_List_iterator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>::operator++(local_18);
            }
            else {
              std::_List_iterator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>::operator*
                        ((_List_iterator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_> *)0x1cf1f9);
              in_stack_fffffffffffffdce =
                   CritPair<8UL,_GF2::MOGrevlex<8UL>_>::operator!=
                             ((CritPair<8UL,_GF2::MOGrevlex<8UL>_> *)
                              CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),
                              (CritPair<8UL,_GF2::MOGrevlex<8UL>_> *)
                              in_stack_fffffffffffffda8._M_node);
              if ((bool)in_stack_fffffffffffffdce) {
                *(long *)(in_RDI + 0x98) = *(long *)(in_RDI + 0x98) + 1;
                break;
              }
              *(long *)(in_RDI + 0xa0) = *(long *)(in_RDI + 0xa0) + 1;
              std::_List_iterator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>::operator->
                        ((_List_iterator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_> *)0x1cf25e);
              in_stack_fffffffffffffdcd =
                   CritPair<8UL,_GF2::MOGrevlex<8UL>_>::IsRelPrime
                             ((CritPair<8UL,_GF2::MOGrevlex<8UL>_> *)
                              CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0));
              if (((bool)in_stack_fffffffffffffdcd) ||
                 (in_stack_fffffffffffffdcc =
                       CritPair<8UL,_GF2::MOGrevlex<8UL>_>::IsRelPrime
                                 ((CritPair<8UL,_GF2::MOGrevlex<8UL>_> *)
                                  CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0)),
                 !(bool)in_stack_fffffffffffffdcc)) break;
              std::_List_const_iterator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>::
              _List_const_iterator(&local_170,local_18);
              local_168 = (_List_node_base *)
                          std::__cxx11::
                          list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                          ::erase((list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                                   *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
                                  in_stack_fffffffffffffda8._M_node);
              local_18[0]._M_node = local_168;
            }
          }
          local_178._M_node =
               (_List_node_base *)
               std::__cxx11::
               list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
               ::end((list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                      *)in_stack_fffffffffffffd98);
          bVar1 = std::operator!=(local_18,&local_178);
          if (!bVar1) {
            local_180 = (_List_node_base *)
                        std::__cxx11::
                        list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                        ::begin((list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                                 *)in_stack_fffffffffffffd98);
            local_18[0]._M_node = local_180;
            while( true ) {
              local_188._M_node =
                   (_List_node_base *)
                   std::__cxx11::
                   list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                   ::end((list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                          *)in_stack_fffffffffffffd98);
              bVar1 = std::operator!=(local_18,&local_188);
              if (!bVar1) break;
              std::_List_iterator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>::operator*
                        ((_List_iterator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_> *)0x1cf385);
              in_stack_fffffffffffffdcb =
                   CritPair<8UL,_GF2::MOGrevlex<8UL>_>::operator|
                             ((CritPair<8UL,_GF2::MOGrevlex<8UL>_> *)
                              CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),
                              (CritPair<8UL,_GF2::MOGrevlex<8UL>_> *)
                              in_stack_fffffffffffffda8._M_node);
              in_stack_fffffffffffffdca = 0;
              if ((bool)in_stack_fffffffffffffdcb) {
                std::_List_iterator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>::operator*
                          ((_List_iterator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_> *)0x1cf3bc);
                in_stack_fffffffffffffdc9 =
                     CritPair<8UL,_GF2::MOGrevlex<8UL>_>::operator!=
                               ((CritPair<8UL,_GF2::MOGrevlex<8UL>_> *)
                                CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0),
                                (CritPair<8UL,_GF2::MOGrevlex<8UL>_> *)
                                in_stack_fffffffffffffda8._M_node);
                in_stack_fffffffffffffdca = 0;
                if ((bool)in_stack_fffffffffffffdc9) {
                  std::_List_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>::operator->
                            ((_List_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_> *)0x1cf3f0);
                  in_stack_fffffffffffffdb8._M_node =
                       (_List_node_base *)
                       MP<8UL,_GF2::MOGrevlex<8UL>_>::LM
                                 ((MP<8UL,_GF2::MOGrevlex<8UL>_> *)
                                  CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
                  pCVar2 = std::_List_iterator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>::
                           operator->((_List_iterator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_> *)
                                      0x1cf40a);
                  in_stack_fffffffffffffdc0._M_node = (_List_node_base *)&(pCVar2->field_0).lm1;
                  std::_List_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>::operator->
                            ((_List_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_> *)0x1cf420);
                  MP<8UL,_GF2::MOGrevlex<8UL>_>::LM
                            ((MP<8UL,_GF2::MOGrevlex<8UL>_> *)
                             CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
                  LCM<8ul,8ul>((MM<8UL> *)in_stack_fffffffffffffdb8._M_node,
                               (MM<8UL> *)
                               CONCAT17(in_stack_fffffffffffffdb7,in_stack_fffffffffffffdb0));
                  in_stack_fffffffffffffdb7 =
                       MM<8ul>::operator|((MM<8UL> *)
                                          CONCAT17(in_stack_fffffffffffffda7,
                                                   in_stack_fffffffffffffda0),
                                          (MM<8UL> *)in_stack_fffffffffffffd98);
                  in_stack_fffffffffffffdca = in_stack_fffffffffffffdb7 ^ 0xff;
                }
              }
              if ((in_stack_fffffffffffffdca & 1) == 0) {
                std::_List_iterator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>::operator++(local_18)
                ;
              }
              else {
                std::_List_const_iterator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>::
                _List_const_iterator(&local_1a0,local_18);
                local_198 = (_List_node_base *)
                            std::__cxx11::
                            list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                            ::erase((list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                                     *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0)
                                    ,in_stack_fffffffffffffda8._M_node);
                *(long *)(in_RDI + 0x98) = *(long *)(in_RDI + 0x98) + 1;
                local_18[0]._M_node = local_198;
              }
            }
            std::_List_const_iterator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>::
            _List_const_iterator(&local_1a8,local_18);
            __position._M_node._1_1_ = in_stack_fffffffffffffdc9;
            __position._M_node._0_1_ = in_stack_fffffffffffffdc8;
            __position._M_node._2_1_ = in_stack_fffffffffffffdca;
            __position._M_node._3_1_ = in_stack_fffffffffffffdcb;
            __position._M_node._4_1_ = in_stack_fffffffffffffdcc;
            __position._M_node._5_1_ = in_stack_fffffffffffffdcd;
            __position._M_node._6_1_ = in_stack_fffffffffffffdce;
            __position._M_node._7_1_ = in_stack_fffffffffffffdcf;
            in_stack_fffffffffffffda8 =
                 std::__cxx11::
                 list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                 ::insert(in_stack_fffffffffffffdc0._M_node,__position,
                          in_stack_fffffffffffffdb8._M_node);
            local_1b0 = in_stack_fffffffffffffda8._M_node;
          }
        }
        std::_List_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>::operator++(local_50);
      } while( true );
    }
    std::_List_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_>::operator->
              ((_List_iterator<GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>_> *)0x1cec5c);
    MP<8UL,_GF2::MOGrevlex<8UL>_>::LM
              ((MP<8UL,_GF2::MOGrevlex<8UL>_> *)
               CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
    std::_List_iterator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>::operator->
              ((_List_iterator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_> *)0x1cec79);
    bVar1 = MM<8ul>::operator|((MM<8UL> *)
                               CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
                               (MM<8UL> *)in_stack_fffffffffffffd98);
    if (!bVar1) {
LAB_001ced24:
      std::_List_iterator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>::operator++(local_18);
      goto LAB_001cec18;
    }
    std::_List_iterator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>::operator->
              ((_List_iterator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_> *)0x1ceca3);
    bVar1 = CritPair<8UL,_GF2::MOGrevlex<8UL>_>::IsRPair
                      ((CritPair<8UL,_GF2::MOGrevlex<8UL>_> *)0x1cecab);
    if (bVar1) goto LAB_001ced24;
    std::_List_const_iterator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>::_List_const_iterator
              (&local_30,local_18);
    local_28 = (_List_node_base *)
               std::__cxx11::
               list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
               ::erase((list<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>,_std::allocator<GF2::CritPair<8UL,_GF2::MOGrevlex<8UL>_>_>_>
                        *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
                       in_stack_fffffffffffffda8._M_node);
    *(long *)(in_RDI + 0x90) = *(long *)(in_RDI + 0x90) + 1;
    local_18[0]._M_node = local_28;
  } while( true );
}

Assistant:

void _Update(typename _I::iterator posPoly)
	{
		// критерий A:
		// если LM(poly) | [LM(f_i), LM(f_j)] и (f_i, f_j) не является r-парой,
		// то (f_i, f_j) можно исключить
		auto posPair = _pairs.begin();
		for (; posPair != _pairs.end();)
			if ((posPoly->LM() | posPair->lcm) && !posPair->IsRPair())
				posPair = _pairs.erase(posPair), _stat.a_criterion++;
			else 
				++posPair;

		// формируем r-пары (f_i, poly), где LM(poly) | LM(f_i)
		// удаляем многочлены f_i
		// .
		// если LM(poly) \not| LM(f_i), то LM(poly) \neq LM(f_i)
		// поэтому LM(f_i mod poly) == LM(f_i) и f_i можно заменить 
		// на f_i mod poly без изменения характеристики lcm всех S-многочленов,
		// в которые входит f_i
		_CPs newpairs;
		// цикл по многочленам базиса
		_Iterator posBasis = _basis.begin();
		for (; posBasis != _basis.end();)
		{
			if (posPoly == posBasis)
			{
				++posBasis;
				continue;
			}
			// подходящий для r-пары многочлен *posBasis?
			if (posPoly->LM() | posBasis->LM())
			{
				// переводим многочлен в резерв
				_Iterator posReserve = _reserve.Splice(_basis, posBasis++);
				// добавляем новую критическую пару
				newpairs.push_front(_CP(posReserve, posPoly));
				_stat.r_criterion++;
			}
			// упрощаем *posBasis
			else posBasis->Mod(*posPoly), ++posBasis;
		}
		// добавляем r-пары в список критических пар
		newpairs.sort();
		_pairs.merge(newpairs);

		// добавляем пары (x_i^2 - x_i, poly)  
		// с учетом первого критерия Бухбергера рассматриваем только
		// такие i, что LM(poly) содержит x_i
		for (size_t var = 0; var < _n; var++)
			// есть зацепление?
			if (posPoly->LM().Test(var))
				newpairs.push_front(_CP(var, posPoly));

		// добавляем пары (f, poly), f -- явные многочлены _basis, 
		// в список пар с учетом критериев B, С:
		// если в _basis найдется f_i т.ч. 
		// [LM(f_i), LM(poly)] | [LM(f_j), LM(poly)],
		// и LM(poly) не делит [LM(f_i), LM(f_j)] или одна из пар (f_i, f_j), 
		// (f_j,f_i) уже обработана, то 
		// a) пару (f_j, poly) можно исключить, 
		//    если [LM(f_i), LM(poly)] != [LM(f_j), LM(poly)] (критерий B);
		// б) одну из пар (f_i, poly), (f_j, poly) можно исключить,
		//    если [LM(f_i), LM(poly)] == [LM(f_j), LM(poly)] (критерий С);
		// .
		// важно: f_i не может быть уравнением поля
		// важно: при применении критерия С в первую очередь исключается пара
		//		  с зацеплением
		// важно: (f_j, poly) не может быть r-парой
		for (posBasis = _basis.begin(); posBasis != _basis.end(); ++posBasis)
		{
			if (posBasis == posPoly) continue;
			// добавляемая пара
			_CP newpair(posBasis, posPoly);
			// цикл по имеющимся парам
			posPair = newpairs.begin();
			for (; posPair != newpairs.end();)
			{
				// выполняются условия делимости?
				if ((*posPair | newpair) && 
					(!(posPoly->LM() | LCM(posPair->lm1, posBasis->LM()))))
				{
					// новая пара исключается критерием B?
					if (*posPair != newpair)
					{
						_stat.b_criterion++;
						break;
					}
					// действует критерий C
					_stat.c_criterion++;
					// новая пара исключается критерием C?
					if (posPair->IsRelPrime() || !newpair.IsRelPrime())
						break;
					// новая пара исключает пару *posPair по критерию C
					posPair = newpairs.erase(posPair);
				}
				else
					++posPair;
			}
			// пара исключена критерием B или С? к следующей
			if (posPair != newpairs.end()) 
				continue;
			// снова цикл по имеющимся парам: пробуем их исключить
			for (posPair = newpairs.begin(); posPair != newpairs.end();)
				// критерий B исключает *posPair?
				if ((newpair | *posPair) && newpair != *posPair &&
					(!(posPoly->LM() | LCM(posPair->lm1, posBasis->LM()))))
						posPair = newpairs.erase(posPair), _stat.b_criterion++;
				else
					++posPair;
			// добавляем пару
			newpairs.insert(posPair, newpair);
		}
		// применяем первый критерий Бухбергера: удаляем пары без зацепления
		for (posPair = newpairs.begin(); posPair != newpairs.end();)
			if (posPair->IsRelPrime())
				_stat.buch_criterion++,
				posPair = newpairs.erase(posPair);
			else
				++posPair;
		// слияние списков пар
		newpairs.sort();
		_pairs.merge(newpairs);
	}